

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_sse4.c
# Opt level: O0

void aom_compute_flow_at_point_sse4_1
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double step_v;
  double step_u;
  int itr;
  uint8_t *src_patch;
  int b [2];
  int16_t dy [64];
  int16_t dx [64];
  double M_inv [4];
  double M [4];
  double in_stack_000001b0;
  int in_stack_000001b8;
  int in_stack_000001bc;
  int in_stack_000001c4;
  int in_stack_00000860;
  int16_t *in_stack_00000868;
  int16_t *in_stack_00000870;
  int *in_stack_00000878;
  int local_17c;
  int local_170;
  int local_16c;
  double *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  int16_t *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  int16_t *in_stack_ffffffffffffff08;
  int16_t *in_stack_ffffffffffffff18;
  int16_t *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  uint8_t *in_stack_ffffffffffffff30;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48 [8];
  
  sobel_filter(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
  compute_flow_matrix(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                      in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
  invert_2x2(local_48,&local_68);
  local_17c = 0;
  while( true ) {
    if (3 < local_17c) {
      return;
    }
    compute_flow_vector((uint8_t *)v,(uint8_t *)u,in_stack_000001c4,stride,in_stack_000001bc,
                        in_stack_000001b8,in_stack_00000860,in_stack_000001b0,(double)src,
                        in_stack_00000868,in_stack_00000870,in_stack_00000878);
    dVar1 = local_68 * (double)local_170 + local_60 * (double)local_16c;
    dVar2 = local_58 * (double)local_170 + local_50 * (double)local_16c;
    dVar3 = fclamp(dVar1 * 1.0,-2.0,2.0);
    *in_stack_00000010 = dVar3 + *in_stack_00000010;
    dVar3 = fclamp(dVar2 * 1.0,-2.0,2.0);
    *in_stack_00000018 = dVar3 + *in_stack_00000018;
    if (ABS(dVar1) + ABS(dVar2) < 0.125) break;
    local_17c = local_17c + 1;
  }
  return;
}

Assistant:

void aom_compute_flow_at_point_sse4_1(const uint8_t *src, const uint8_t *ref,
                                      int x, int y, int width, int height,
                                      int stride, double *u, double *v) {
  DECLARE_ALIGNED(16, double, M[4]);
  DECLARE_ALIGNED(16, double, M_inv[4]);
  DECLARE_ALIGNED(16, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(16, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}